

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

void __thiscall
cmStateDirectory::AppendProperty
          (cmStateDirectory *this,string *prop,char *value,bool asString,cmListFileBacktrace *lfbt)

{
  int iVar1;
  PointerType pBVar2;
  allocator<char> local_49;
  string local_48;
  
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,value,&local_49);
    AppendIncludeDirectoriesEntry(this,&local_48,lfbt);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)prop);
    if (iVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,value,&local_49);
      AppendCompileOptionsEntry(this,&local_48,lfbt);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)prop);
      if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,value,&local_49);
        AppendCompileDefinitionsEntry(this,&local_48,lfbt);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)prop);
        if (iVar1 == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,value,&local_49);
          AppendLinkOptionsEntry(this,&local_48,lfbt);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)prop);
          if (iVar1 != 0) {
            pBVar2 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmPropertyMap::AppendProperty(&pBVar2->Properties,prop,value,asString);
            return;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,value,&local_49);
          AppendLinkDirectoriesEntry(this,&local_48,lfbt);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmStateDirectory::AppendProperty(const std::string& prop,
                                      const char* value, bool asString,
                                      cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    this->AppendIncludeDirectoriesEntry(value, lfbt);
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    this->AppendCompileOptionsEntry(value, lfbt);
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    this->AppendCompileDefinitionsEntry(value, lfbt);
    return;
  }
  if (prop == "LINK_OPTIONS") {
    this->AppendLinkOptionsEntry(value, lfbt);
    return;
  }
  if (prop == "LINK_DIRECTORIES") {
    this->AppendLinkDirectoriesEntry(value, lfbt);
    return;
  }

  this->DirectoryState->Properties.AppendProperty(prop, value, asString);
}